

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int write_file_descriptors(archive_write *a)

{
  char cVar1;
  undefined4 uVar2;
  void *pvVar3;
  undefined2 uVar4;
  int iVar5;
  long offset;
  undefined1 uVar6;
  long lVar7;
  long lVar8;
  iso9660_conflict *iso9660;
  long lVar9;
  long *plVar10;
  short sVar11;
  
  pvVar3 = a->format_data;
  if (*(long *)((long)pvVar3 + 0x10320) != 0) {
    lVar9 = *(long *)((long)pvVar3 + 0x102e0);
    memset((void *)((long)pvVar3 + (0x102dd - lVar9)),0,0x7ff);
    *(undefined1 *)((long)pvVar3 + (0x102dc - lVar9)) = 1;
    *(undefined1 *)((long)pvVar3 + (0x102dd - lVar9)) = *(undefined1 *)((long)pvVar3 + 0x10348);
    *(undefined2 *)((long)pvVar3 + (0x102de - lVar9)) = 0;
    if (*(long *)((long)pvVar3 + 0x10358) != 0) {
      strncpy((char *)((long)pvVar3 + (0x102e0 - lVar9)),*(char **)((long)pvVar3 + 0x10350),0x17);
    }
    *(undefined4 *)((long)pvVar3 + (0x102f7 - lVar9)) = 0x55000000;
    *(undefined2 *)((long)pvVar3 + (0x102fb - lVar9)) = 0x88aa;
    sVar11 = *(short *)((long)pvVar3 + (0x102fa - lVar9)) +
             *(short *)((long)pvVar3 + (0x102ea - lVar9)) +
             *(short *)((long)pvVar3 + (0x102f2 - lVar9)) +
             *(short *)((long)pvVar3 + (0x102e2 - lVar9)) +
             *(short *)((long)pvVar3 + (0x102f6 - lVar9)) +
             *(short *)((long)pvVar3 + (0x102e6 - lVar9)) +
             *(short *)((long)pvVar3 + (0x102ee - lVar9)) +
             *(short *)((long)pvVar3 + (0x102de - lVar9));
    iVar5 = -CONCAT22(sVar11,sVar11 + *(short *)((long)pvVar3 + (0x102f8 - lVar9)) +
                                      *(short *)((long)pvVar3 + (0x102e8 - lVar9)) +
                                      *(short *)((long)pvVar3 + (0x102f0 - lVar9)) +
                                      *(short *)((long)pvVar3 + (0x102e0 - lVar9)) +
                                      *(short *)((long)pvVar3 + (0x102f4 - lVar9)) +
                                      *(short *)((long)pvVar3 + (0x102e4 - lVar9)) +
                                      *(short *)((long)pvVar3 + (0x102ec - lVar9)) +
                                      *(short *)((long)pvVar3 + (0x102dc - lVar9)));
    *(char *)((long)pvVar3 + (0x102f8 - lVar9)) = (char)iVar5;
    *(char *)((long)pvVar3 + (0x102f9 - lVar9)) = (char)((uint)iVar5 >> 8);
    cVar1 = *(char *)((long)pvVar3 + 0x10368);
    *(char *)((long)pvVar3 + (0x102fd - lVar9)) = cVar1;
    if (cVar1 == '\0') {
      uVar4 = *(undefined2 *)((long)pvVar3 + 0x1036a);
      uVar6 = (undefined1)((ushort)uVar4 >> 8);
    }
    else {
      uVar4 = 0;
      uVar6 = 0;
    }
    *(char *)((long)pvVar3 + (0x102fe - lVar9)) = (char)uVar4;
    *(undefined1 *)((long)pvVar3 + (0x102ff - lVar9)) = uVar6;
    *(undefined1 *)((long)pvVar3 + (0x10300 - lVar9)) = *(undefined1 *)((long)pvVar3 + 0x10369);
    *(undefined1 *)((long)pvVar3 + (0x10301 - lVar9)) = 0;
    if (*(char *)((long)pvVar3 + 0x10368) == '\0') {
      uVar4 = *(undefined2 *)((long)pvVar3 + 0x1036c);
      uVar6 = (undefined1)((ushort)uVar4 >> 8);
    }
    else {
      uVar4 = 1;
      uVar6 = 0;
    }
    *(char *)((long)pvVar3 + (0x10302 - lVar9)) = (char)uVar4;
    *(undefined1 *)((long)pvVar3 + (0x10303 - lVar9)) = uVar6;
    uVar2 = *(undefined4 *)(*(long *)(*(long *)((long)pvVar3 + 0x10340) + 0x18) + 0xa4);
    *(char *)((long)pvVar3 + (0x10304 - lVar9)) = (char)uVar2;
    *(char *)((long)pvVar3 + (0x10305 - lVar9)) = (char)((uint)uVar2 >> 8);
    *(char *)((long)pvVar3 + (0x10306 - lVar9)) = (char)((uint)uVar2 >> 0x10);
    *(char *)((long)pvVar3 + (0x10307 - lVar9)) = (char)((uint)uVar2 >> 0x18);
    *(undefined1 (*) [16])((long)pvVar3 + (0x10308 - lVar9)) = (undefined1  [16])0x0;
    *(undefined4 *)((long)pvVar3 + (0x10318 - lVar9)) = 0;
    iVar5 = wb_consume(a,0x800);
    if (iVar5 < 0) {
      return iVar5;
    }
  }
  if (*(long *)((long)pvVar3 + 0x10340) != 0) {
    lVar9 = *(long *)(*(long *)((long)pvVar3 + 0x10340) + 0x18);
    lVar7 = (long)*(int *)(lVar9 + 0xa0);
    lVar9 = *(long *)(lVar9 + 0x90);
    if (lVar9 == 0) goto LAB_00156c29;
    iVar5 = write_file_contents(a,lVar9,lVar7 << 0xb);
    if (iVar5 < 0) {
      return iVar5;
    }
  }
  lVar7 = 0;
LAB_00156c29:
  lVar9 = *(long *)((long)pvVar3 + 0x98);
  if (lVar9 == 0) {
    offset = 0;
  }
  else {
    offset = 0;
    do {
      if (*(int *)(lVar9 + 0xb8) != 0) {
        plVar10 = (long *)(lVar9 + 0x90);
        lVar8 = *(long *)(lVar9 + 0x90);
        if (offset + lVar7 * 0x800 < lVar8) {
          if (0 < lVar7) {
            iVar5 = write_file_contents(a,offset,lVar7 * 0x800);
            if (iVar5 < 0) {
              return iVar5;
            }
            lVar8 = *plVar10;
          }
          lVar7 = 0;
          offset = lVar8;
        }
        do {
          lVar7 = lVar7 + (int)plVar10[2];
          plVar10 = (long *)plVar10[3];
        } while (plVar10 != (long *)0x0);
        *(undefined8 *)(lVar9 + 0xb0) = 0;
      }
      lVar9 = *(long *)(lVar9 + 8);
    } while (lVar9 != 0);
  }
  if ((lVar7 < 1) || (iVar5 = write_file_contents(a,offset,lVar7 << 0xb), -1 < iVar5)) {
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int
write_file_descriptors(struct archive_write *a)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isofile *file;
	int64_t blocks, offset;
	int r;

	blocks = 0;
	offset = 0;

	/* Make the boot catalog contents, and write it. */
	if (iso9660->el_torito.catalog != NULL) {
		r = make_boot_catalog(a);
		if (r < 0)
			return (r);
	}

	/* Write the boot file contents. */
	if (iso9660->el_torito.boot != NULL) {
		file = iso9660->el_torito.boot->file;
		blocks = file->content.blocks;
		offset = file->content.offset_of_temp;
		if (offset != 0) {
			r = write_file_contents(a, offset,
			    blocks << LOGICAL_BLOCK_BITS);
			if (r < 0)
				return (r);
			blocks = 0;
			offset = 0;
		}
	}

	/* Write out all file contents. */
	for (file = iso9660->data_file_list.first;
	    file != NULL; file = file->datanext) {

		if (!file->write_content)
			continue;

		if ((offset + (blocks << LOGICAL_BLOCK_BITS)) <
		     file->content.offset_of_temp) {
			if (blocks > 0) {
				r = write_file_contents(a, offset,
				    blocks << LOGICAL_BLOCK_BITS);
				if (r < 0)
					return (r);
			}
			blocks = 0;
			offset = file->content.offset_of_temp;
		}

		file->cur_content = &(file->content);
		do {
			blocks += file->cur_content->blocks;
			/* Next fragument */
			file->cur_content = file->cur_content->next;
		} while (file->cur_content != NULL);
	}

	/* Flush out remaining blocks. */
	if (blocks > 0) {
		r = write_file_contents(a, offset,
		    blocks << LOGICAL_BLOCK_BITS);
		if (r < 0)
			return (r);
	}

	return (ARCHIVE_OK);
}